

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_set_handler.c
# Opt level: O3

sig_handler_t * sig_set_handler(int signo,sig_handler_t *handler)

{
  int iVar1;
  sigaction old_act;
  sigaction act;
  _union_1457 local_140 [19];
  _union_1457 local_a8;
  sigset_t local_a0;
  undefined4 local_20;
  
  local_a8 = (_union_1457)handler;
  sigemptyset(&local_a0);
  local_20 = 0;
  iVar1 = sigaction(signo,(sigaction *)&local_a8,(sigaction *)local_140);
  if (iVar1 < 0) {
    perror("sigaction");
    local_140[0] = (_union_1457)0xffffffffffffffff;
  }
  return (sig_handler_t *)local_140[0].sa_handler;
}

Assistant:

sig_handler_t *sig_set_handler(int signo, sig_handler_t *handler) {
  struct sigaction act, old_act;

  act.sa_handler = handler;
  sigemptyset(&act.sa_mask);
  act.sa_flags = 0;

  if (sigaction(signo, &act, &old_act) < 0) {
    perror("sigaction");
    return SIG_ERR;
  }

  return old_act.sa_handler;
}